

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  long lVar1;
  bool bVar2;
  Node *n;
  int n_00;
  Node *this_00;
  Node **ppNVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = (this->max_height_).super___atomic_base<int>._M_i + -1;
  n = this->head_;
  do {
    this_00 = n;
    ppNVar3 = prev + n_00;
    while( true ) {
      n = Node::Next(this_00,n_00);
      bVar2 = KeyIsAfterNode(this,key,n);
      if (bVar2) break;
      if (prev != (Node **)0x0) {
        *ppNVar3 = this_00;
      }
      bVar2 = n_00 == 0;
      n_00 = n_00 + -1;
      if (bVar2) {
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return n;
      }
      ppNVar3 = ppNVar3 + -1;
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}